

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

string * beast::detail::base64_decode<void>(string *__return_storage_ptr__,string *data)

{
  size_t sVar1;
  void *dest_00;
  char *src;
  pair<unsigned_long,_unsigned_long> result;
  string *data_local;
  string *dest;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = std::__cxx11::string::size();
  base64::decoded_size(sVar1);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  dest_00 = (void *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  src = (char *)std::__cxx11::string::data();
  sVar1 = std::__cxx11::string::size();
  base64::decode<void>(dest_00,src,sVar1);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
base64_decode(std::string const& data)
{
    std::string dest;
    dest.resize(base64::decoded_size(data.size()));
    auto const result = base64::decode(
        &dest[0], data.data(), data.size());
    dest.resize(result.first);
    return dest;
}